

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_header.c
# Opt level: O1

exr_result_t save_box2f(exr_context_t ctxt,exr_attribute_t *a)

{
  exr_attr_box2i_t *peVar1;
  exr_result_t eVar2;
  int32_t isz;
  exr_attr_box2f_t tmp;
  undefined4 local_2c;
  int32_t local_28;
  int32_t iStack_24;
  int32_t iStack_20;
  int32_t iStack_1c;
  
  peVar1 = (a->field_6).box2i;
  local_28 = (peVar1->min).x;
  iStack_24 = (peVar1->min).y;
  iStack_20 = (peVar1->max).x;
  iStack_1c = (peVar1->max).y;
  local_2c = 0x10;
  eVar2 = (*ctxt->do_write)(ctxt,&local_2c,4,&ctxt->output_file_offset);
  if (eVar2 == 0) {
    eVar2 = (*ctxt->do_write)(ctxt,&local_28,0x10,&ctxt->output_file_offset);
  }
  return eVar2;
}

Assistant:

static exr_result_t
save_box2f (exr_context_t ctxt, const exr_attribute_t* a)
{
    exr_result_t     rv;
    exr_attr_box2f_t tmp = *(a->box2f);

    rv = save_attr_sz (ctxt, sizeof (exr_attr_box2f_t));
    if (rv == EXR_ERR_SUCCESS) rv = save_attr_32 (ctxt, &tmp, 4);
    return rv;
}